

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  bool bVar1;
  char cVar2;
  ParseFlags PVar3;
  int iVar4;
  ParseFlags PVar5;
  ParseStatus PVar6;
  string *this;
  iterator pcVar7;
  iterator pcVar8;
  iterator pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  UGroup *this_00;
  CharClassBuilder *pCVar13;
  Regexp *pRVar14;
  Rune local_184;
  Regexp *pRStack_180;
  Rune r_2;
  Regexp *re_2;
  UGroup *g;
  Regexp *re_1;
  undefined1 local_160 [4];
  Rune r_3;
  byte local_149;
  undefined1 auStack_148 [7];
  bool nongreedy_1;
  StringPiece opstr_1;
  int hi;
  int lo;
  byte local_119;
  undefined1 auStack_118 [7];
  bool nongreedy;
  StringPiece opstr;
  RegexpOp local_fc;
  Regexp *pRStack_f8;
  RegexpOp op;
  Regexp *re;
  Rune local_dc;
  undefined1 auStack_d8 [4];
  Rune r_1;
  StringPiece isunary;
  StringPiece lastunary;
  undefined1 auStack_b0 [4];
  Rune r;
  int local_a8;
  string *local_a0;
  string *tmp;
  StringPiece t;
  undefined1 local_78 [8];
  ParseState ps;
  RegexpStatus xstatus;
  RegexpStatus *status_local;
  ParseFlags global_flags_local;
  StringPiece *s_local;
  
  RegexpStatus::RegexpStatus((RegexpStatus *)&ps.ncap_);
  xstatus.tmp_ = (string *)status;
  if (status == (RegexpStatus *)0x0) {
    xstatus.tmp_ = (string *)&ps.ncap_;
  }
  ParseState::ParseState((ParseState *)local_78,global_flags,s,(RegexpStatus *)xstatus.tmp_);
  tmp = (string *)s->ptr_;
  t.ptr_ = *(char **)&s->length_;
  PVar3 = operator&(global_flags,Latin1);
  if (PVar3 != NoParseFlags) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string(this);
    local_a0 = (string *)this;
    ConvertLatin1ToUTF8((StringPiece *)&tmp,(string *)this);
    RegexpStatus::set_tmp((RegexpStatus *)xstatus.tmp_,local_a0);
    StringPiece::StringPiece((StringPiece *)auStack_b0,local_a0);
    tmp = _auStack_b0;
    t.ptr_ = (char *)CONCAT44(t.ptr_._4_4_,local_a8);
  }
  PVar3 = operator&(global_flags,Literal);
  if (PVar3 == NoParseFlags) {
    StringPiece::StringPiece((StringPiece *)&isunary.length_,(char *)0x0);
    while (iVar4 = StringPiece::size((StringPiece *)&tmp), 0 < iVar4) {
      StringPiece::StringPiece((StringPiece *)auStack_d8,(char *)0x0);
      cVar2 = StringPiece::operator[]((StringPiece *)&tmp,0);
      switch(cVar2) {
      case '$':
        bVar1 = ParseState::PushDollar((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      default:
        iVar4 = StringPieceToRune(&local_dc,(StringPiece *)&tmp,(RegexpStatus *)xstatus.tmp_);
        if (iVar4 < 0) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        bVar1 = ParseState::PushLiteral((ParseState *)local_78,local_dc);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        break;
      case '(':
        PVar3 = ParseState::flags((ParseState *)local_78);
        PVar3 = operator&(PVar3,PerlX);
        if (((PVar3 == NoParseFlags) || (iVar4 = StringPiece::size((StringPiece *)&tmp), iVar4 < 2))
           || (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 != '?')) {
          PVar3 = ParseState::flags((ParseState *)local_78);
          PVar3 = operator&(PVar3,NeverCapture);
          if (PVar3 == NoParseFlags) {
            StringPiece::StringPiece((StringPiece *)&re,(char *)0x0);
            bVar1 = ParseState::DoLeftParen((ParseState *)local_78,(StringPiece *)&re);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              s_local = (StringPiece *)0x0;
              goto LAB_001763a0;
            }
          }
          else {
            bVar1 = ParseState::DoLeftParenNoCapture((ParseState *)local_78);
            if (!bVar1) {
              s_local = (StringPiece *)0x0;
              goto LAB_001763a0;
            }
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,1);
        }
        else {
          bVar1 = ParseState::ParsePerlFlags((ParseState *)local_78,(StringPiece *)&tmp);
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_001763a0;
          }
        }
        break;
      case ')':
        bVar1 = ParseState::DoRightParen((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '*':
        local_fc = kRegexpStar;
        goto LAB_00175537;
      case '+':
        local_fc = kRegexpPlus;
        goto LAB_00175537;
      case '.':
        bVar1 = ParseState::PushDot((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '?':
        local_fc = kRegexpQuest;
LAB_00175537:
        _auStack_118 = tmp;
        opstr.ptr_ = t.ptr_;
        local_119 = 0;
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        PVar3 = ParseState::flags((ParseState *)local_78);
        PVar3 = operator&(PVar3,PerlX);
        if (PVar3 != NoParseFlags) {
          iVar4 = StringPiece::size((StringPiece *)&tmp);
          if ((0 < iVar4) && (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,0), cVar2 == '?'))
          {
            local_119 = 1;
            StringPiece::remove_prefix((StringPiece *)&tmp,1);
          }
          iVar4 = StringPiece::size((StringPiece *)&isunary.length_);
          if (0 < iVar4) {
            RegexpStatus::set_code((RegexpStatus *)xstatus.tmp_,kRegexpRepeatOp);
            pcVar7 = StringPiece::begin((StringPiece *)&isunary.length_);
            pcVar8 = StringPiece::begin((StringPiece *)&tmp);
            pcVar9 = StringPiece::begin((StringPiece *)&isunary.length_);
            StringPiece::StringPiece((StringPiece *)&hi,pcVar7,(int)pcVar8 - (int)pcVar9);
            RegexpStatus::set_error_arg((RegexpStatus *)xstatus.tmp_,(StringPiece *)&hi);
            s_local = (StringPiece *)0x0;
            goto LAB_001763a0;
          }
        }
        pcVar10 = StringPiece::data((StringPiece *)auStack_118);
        pcVar11 = StringPiece::data((StringPiece *)&tmp);
        pcVar12 = StringPiece::data((StringPiece *)auStack_118);
        StringPiece::set((StringPiece *)auStack_118,pcVar10,(int)pcVar11 - (int)pcVar12);
        bVar1 = ParseState::PushRepeatOp
                          ((ParseState *)local_78,local_fc,(StringPiece *)auStack_118,
                           (bool)(local_119 & 1));
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        _auStack_d8 = _auStack_118;
        isunary.ptr_._0_4_ = opstr.ptr_._0_4_;
        break;
      case '[':
        bVar1 = ParseState::ParseCharClass
                          ((ParseState *)local_78,(StringPiece *)&tmp,&stack0xffffffffffffff08,
                           (RegexpStatus *)xstatus.tmp_);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        bVar1 = ParseState::PushRegexp((ParseState *)local_78,pRStack_f8);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        break;
      case '\\':
        PVar3 = ParseState::flags((ParseState *)local_78);
        PVar3 = operator&(PVar3,PerlB);
        if (((PVar3 == NoParseFlags) || (iVar4 = StringPiece::size((StringPiece *)&tmp), iVar4 < 2))
           || ((cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 != 'b' &&
               (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 != 'B')))) {
          PVar3 = ParseState::flags((ParseState *)local_78);
          PVar3 = operator&(PVar3,PerlX);
          if ((PVar3 == NoParseFlags) || (iVar4 = StringPiece::size((StringPiece *)&tmp), iVar4 < 2)
             ) {
LAB_00175eb8:
            iVar4 = StringPiece::size((StringPiece *)&tmp);
            if ((1 < iVar4) &&
               ((cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 == 'p' ||
                (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 == 'P')))) {
              this_00 = (UGroup *)operator_new(0x28);
              PVar3 = ParseState::flags((ParseState *)local_78);
              PVar5 = operator~(FoldCase);
              PVar3 = operator&(PVar3,PVar5);
              Regexp((Regexp *)this_00,kRegexpCharClass,PVar3);
              g = this_00;
              pCVar13 = (CharClassBuilder *)operator_new(0x40);
              CharClassBuilder::CharClassBuilder(pCVar13);
              g->r32 = (URange32 *)pCVar13;
              PVar3 = ParseState::flags((ParseState *)local_78);
              PVar6 = ParseUnicodeGroup((StringPiece *)&tmp,PVar3,(CharClassBuilder *)g->r32,
                                        (RegexpStatus *)xstatus.tmp_);
              if (PVar6 == kParseOk) {
                bVar1 = ParseState::PushRegexp((ParseState *)local_78,(Regexp *)g);
                if (bVar1) break;
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
              if (PVar6 == kParseError) {
                Decref((Regexp *)g);
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
              if (PVar6 == kParseNothing) {
                Decref((Regexp *)g);
              }
            }
            PVar3 = ParseState::flags((ParseState *)local_78);
            re_2 = (Regexp *)MaybeParsePerlCCEscape((StringPiece *)&tmp,PVar3);
            if ((UGroup *)re_2 == (UGroup *)0x0) {
              iVar4 = ParseState::rune_max((ParseState *)local_78);
              bVar1 = ParseEscape((StringPiece *)&tmp,&local_184,(RegexpStatus *)xstatus.tmp_,iVar4)
              ;
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
              bVar1 = ParseState::PushLiteral((ParseState *)local_78,local_184);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
            }
            else {
              pRVar14 = (Regexp *)operator_new(0x28);
              PVar3 = ParseState::flags((ParseState *)local_78);
              PVar5 = operator~(FoldCase);
              PVar3 = operator&(PVar3,PVar5);
              Regexp(pRVar14,kRegexpCharClass,PVar3);
              pRStack_180 = pRVar14;
              pCVar13 = (CharClassBuilder *)operator_new(0x40);
              CharClassBuilder::CharClassBuilder(pCVar13);
              pRVar14 = re_2;
              (pRStack_180->field_7).field_3.ccb_ = pCVar13;
              pCVar13 = (pRStack_180->field_7).field_3.ccb_;
              iVar4 = *(int *)&re_2->field_5;
              PVar3 = ParseState::flags((ParseState *)local_78);
              AddUGroup(pCVar13,(UGroup *)pRVar14,iVar4,PVar3);
              bVar1 = ParseState::PushRegexp((ParseState *)local_78,pRStack_180);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
            }
          }
          else {
            cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1);
            if (cVar2 == 'A') {
              bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpBeginText);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_001763a0;
              }
              StringPiece::remove_prefix((StringPiece *)&tmp,2);
            }
            else {
              cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1);
              if (cVar2 == 'z') {
                bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpEndText);
                if (!bVar1) {
                  s_local = (StringPiece *)0x0;
                  goto LAB_001763a0;
                }
                StringPiece::remove_prefix((StringPiece *)&tmp,2);
              }
              else {
                cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1);
                if (cVar2 == 'C') {
                  bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpAnyByte);
                  if (!bVar1) {
                    s_local = (StringPiece *)0x0;
                    goto LAB_001763a0;
                  }
                  StringPiece::remove_prefix((StringPiece *)&tmp,2);
                }
                else {
                  cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1);
                  if (cVar2 != 'Q') goto LAB_00175eb8;
                  StringPiece::remove_prefix((StringPiece *)&tmp,2);
                  while (iVar4 = StringPiece::size((StringPiece *)&tmp), 0 < iVar4) {
                    iVar4 = StringPiece::size((StringPiece *)&tmp);
                    if (((1 < iVar4) &&
                        (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,0), cVar2 == '\\')) &&
                       (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1), cVar2 == 'E')) {
                      StringPiece::remove_prefix((StringPiece *)&tmp,2);
                      break;
                    }
                    iVar4 = StringPieceToRune((Rune *)((long)&re_1 + 4),(StringPiece *)&tmp,
                                              (RegexpStatus *)xstatus.tmp_);
                    if (iVar4 < 0) {
                      s_local = (StringPiece *)0x0;
                      goto LAB_001763a0;
                    }
                    bVar1 = ParseState::PushLiteral((ParseState *)local_78,re_1._4_4_);
                    if (!bVar1) {
                      s_local = (StringPiece *)0x0;
                      goto LAB_001763a0;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          cVar2 = StringPiece::operator[]((StringPiece *)&tmp,1);
          bVar1 = ParseState::PushWordBoundary((ParseState *)local_78,cVar2 == 'b');
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_001763a0;
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,2);
        }
        break;
      case '^':
        bVar1 = ParseState::PushCarat((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '{':
        _auStack_148 = tmp;
        opstr_1.ptr_ = t.ptr_;
        bVar1 = MaybeParseRepetition((StringPiece *)&tmp,(int *)&opstr_1.field_0xc,&opstr_1.length_)
        ;
        if (bVar1) {
          local_149 = 0;
          PVar3 = ParseState::flags((ParseState *)local_78);
          PVar3 = operator&(PVar3,PerlX);
          if (PVar3 != NoParseFlags) {
            iVar4 = StringPiece::size((StringPiece *)&tmp);
            if ((0 < iVar4) &&
               (cVar2 = StringPiece::operator[]((StringPiece *)&tmp,0), cVar2 == '?')) {
              local_149 = 1;
              StringPiece::remove_prefix((StringPiece *)&tmp,1);
            }
            iVar4 = StringPiece::size((StringPiece *)&isunary.length_);
            if (0 < iVar4) {
              RegexpStatus::set_code((RegexpStatus *)xstatus.tmp_,kRegexpRepeatOp);
              pcVar7 = StringPiece::begin((StringPiece *)&isunary.length_);
              pcVar8 = StringPiece::begin((StringPiece *)&tmp);
              pcVar9 = StringPiece::begin((StringPiece *)&isunary.length_);
              StringPiece::StringPiece((StringPiece *)local_160,pcVar7,(int)pcVar8 - (int)pcVar9);
              RegexpStatus::set_error_arg((RegexpStatus *)xstatus.tmp_,(StringPiece *)local_160);
              s_local = (StringPiece *)0x0;
              goto LAB_001763a0;
            }
          }
          pcVar10 = StringPiece::data((StringPiece *)auStack_148);
          pcVar11 = StringPiece::data((StringPiece *)&tmp);
          pcVar12 = StringPiece::data((StringPiece *)auStack_148);
          StringPiece::set((StringPiece *)auStack_148,pcVar10,(int)pcVar11 - (int)pcVar12);
          bVar1 = ParseState::PushRepetition
                            ((ParseState *)local_78,opstr_1._12_4_,opstr_1.length_,
                             (StringPiece *)auStack_148,(bool)(local_149 & 1));
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_001763a0;
          }
          _auStack_d8 = _auStack_148;
          isunary.ptr_._0_4_ = opstr_1.ptr_._0_4_;
        }
        else {
          bVar1 = ParseState::PushLiteral((ParseState *)local_78,0x7b);
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_001763a0;
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,1);
        }
        break;
      case '|':
        bVar1 = ParseState::DoVerticalBar((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_001763a0;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
      }
      isunary._8_8_ = _auStack_d8;
      lastunary.ptr_._0_4_ = isunary.ptr_._0_4_;
    }
    s_local = (StringPiece *)ParseState::DoFinish((ParseState *)local_78);
  }
  else {
    do {
      iVar4 = StringPiece::size((StringPiece *)&tmp);
      if (iVar4 < 1) {
        s_local = (StringPiece *)ParseState::DoFinish((ParseState *)local_78);
        goto LAB_001763a0;
      }
      iVar4 = StringPieceToRune((Rune *)&lastunary.field_0xc,(StringPiece *)&tmp,
                                (RegexpStatus *)xstatus.tmp_);
      if (iVar4 < 0) {
        s_local = (StringPiece *)0x0;
        goto LAB_001763a0;
      }
      bVar1 = ParseState::PushLiteral((ParseState *)local_78,lastunary._12_4_);
    } while (bVar1);
    s_local = (StringPiece *)0x0;
  }
LAB_001763a0:
  lastunary.length_ = 1;
  ParseState::~ParseState((ParseState *)local_78);
  RegexpStatus::~RegexpStatus((RegexpStatus *)&ps.ncap_);
  return (Regexp *)s_local;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    string* tmp = new string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = NULL;
  while (t.size() > 0) {
    StringPiece isunary = NULL;
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(NULL))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}